

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPTCPTransmitter::WaitForIncomingData
          (RTPTCPTransmitter *this,RTPTime *delay,bool *dataavailable)

{
  vector<signed_char,_std::allocator<signed_char>_> *this_00;
  _Rb_tree_header *p_Var1;
  SocketType SVar2;
  SocketType *sockets;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  iVar5 = -0xb5;
  if (((this->m_init == true) && (iVar5 = -0xbb, this->m_created == true)) &&
     (iVar5 = -0xba, this->m_waitingForData == false)) {
    std::vector<int,_std::allocator<int>_>::resize
              (&this->m_tmpSocks,
               (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
    this_00 = &this->m_tmpFlags;
    std::vector<signed_char,_std::allocator<signed_char>_>::resize
              (this_00,(long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 2);
    p_Var6 = (this->m_destSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    SVar2 = this->m_pAbortDesc->m_descriptors[0];
    p_Var1 = &(this->m_destSockets)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var6 == p_Var1) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] = p_Var6[1]._M_color;
        (this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = '\0';
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        uVar7 = uVar7 + 1;
      } while ((_Rb_tree_header *)p_Var6 != p_Var1);
      uVar7 = uVar7 & 0xffffffff;
    }
    (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar7] = SVar2;
    (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = '\0';
    this->m_waitingForData = true;
    sockets = (this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar5 = RTPSelect(sockets,(this->m_tmpFlags).
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                      (long)(this->m_tmpSocks).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)sockets >> 2,
                      (RTPTime)delay->m_t);
    this->m_waitingForData = false;
    if ((-1 < iVar5) && (iVar5 = 0, this->m_created == true)) {
      if ((this_00->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar7] != '\0') {
        RTPAbortDescriptors::ReadSignallingByte(this->m_pAbortDesc);
      }
      iVar5 = 0;
      if (dataavailable != (bool *)0x0) {
        pcVar3 = (this->m_tmpFlags).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar5 = 0;
        uVar7 = (long)(this->m_tmpFlags).
                      super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar3;
        if (uVar7 == 0) {
          bVar9 = false;
        }
        else {
          bVar9 = true;
          if (*pcVar3 == '\0') {
            uVar4 = 1;
            do {
              uVar8 = uVar4;
              if (uVar7 + (uVar7 == 0) == uVar8) break;
              uVar4 = uVar8 + 1;
            } while (pcVar3[uVar8] == '\0');
            bVar9 = uVar8 < uVar7;
          }
        }
        *dataavailable = bVar9;
      }
    }
  }
  return iVar5;
}

Assistant:

int RTPTCPTransmitter::WaitForIncomingData(const RTPTime &delay,bool *dataavailable)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	
	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}
	if (m_waitingForData)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_ALREADYWAITING;
	}
	
	m_tmpSocks.resize(m_destSockets.size()+1);
	m_tmpFlags.resize(m_tmpSocks.size());
	SocketType abortSocket = m_pAbortDesc->GetAbortSocket();

	std::map<SocketType, SocketData>::iterator it = m_destSockets.begin();
	std::map<SocketType, SocketData>::iterator end = m_destSockets.end();
	int idx = 0;

	while (it != end)
	{
		m_tmpSocks[idx] = it->first;
		m_tmpFlags[idx] = 0;
		++it;
		idx++;
	}
	m_tmpSocks[idx] = abortSocket;
	m_tmpFlags[idx] = 0;
	int idxAbort = idx;

	m_waitingForData = true;
	
	WAITMUTEX_LOCK
	MAINMUTEX_UNLOCK

	//cout << "Waiting for " << delay.GetDouble() << " seconds for data on " << m_tmpSocks.size() << " sockets" << endl;
	int status = RTPSelect(&m_tmpSocks[0], &m_tmpFlags[0], m_tmpSocks.size(), delay);
	if (status < 0)
	{
		MAINMUTEX_LOCK
		m_waitingForData = false;
		MAINMUTEX_UNLOCK
		WAITMUTEX_UNLOCK
		return status;
	}
	
	MAINMUTEX_LOCK
	m_waitingForData = false;
	if (!m_created) // destroy called
	{
		MAINMUTEX_UNLOCK;
		WAITMUTEX_UNLOCK
		return 0;
	}
		
	// if aborted, read from abort buffer
	if (m_tmpFlags[idxAbort])
		m_pAbortDesc->ReadSignallingByte();

	if (dataavailable != 0)
	{
		bool avail = false;

		for (size_t i = 0 ; i < m_tmpFlags.size() ; i++)
		{
			if (m_tmpFlags[i])
			{
				avail = true;
				//cout << "Data available!" << endl;
				break;
			}
		}

		if (avail)
			*dataavailable = true;
		else
			*dataavailable = false;
	}	
	
	MAINMUTEX_UNLOCK
	WAITMUTEX_UNLOCK
	return 0;
}